

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIFFImageHandler.cpp
# Opt level: O2

EStatusCode __thiscall TIFFImageHandler::ReadPhotometricPalette(TIFFImageHandler *this)

{
  int iVar1;
  T2P *pTVar2;
  uchar *puVar3;
  long lVar4;
  Trace *pTVar5;
  int i;
  ulong uVar6;
  pointer pcVar7;
  char *inFormat;
  uint16_t *b;
  uint16_t *g;
  uint16_t *r;
  
  pTVar2 = this->mT2p;
  if (pTVar2->tiff_samplesperpixel == 1) {
    pTVar2->pdf_colorspace = T2P_CS_PALETTE|T2P_CS_RGB;
    pTVar2->pdf_palettesize = (uint16_t)(1 << ((byte)pTVar2->tiff_bitspersample & 0x1f));
    iVar1 = TIFFGetField(pTVar2->input,0x140,&r,&g,&b);
    if (iVar1 != 0) {
      pTVar2 = this->mT2p;
      if (pTVar2->pdf_palette != (uchar *)0x0) {
        _TIFFfree(pTVar2->pdf_palette);
        pTVar2 = this->mT2p;
        pTVar2->pdf_palette = (uchar *)0x0;
      }
      puVar3 = (uchar *)_TIFFmalloc((ulong)pTVar2->pdf_palettesize * 3);
      pTVar2 = this->mT2p;
      pTVar2->pdf_palette = puVar3;
      if (puVar3 == (uchar *)0x0) {
        pTVar5 = Trace::DefaultTrace();
        Trace::TraceToLog(pTVar5,
                          "TIFFImageHandler::ReadTIFFPageInformation, Can\'t allocate %u bytes of memory for t2p_read_tiff_image, %s"
                          ,(ulong)this->mT2p->pdf_palettesize,
                          (this->mT2p->inputFilePath)._M_dataplus._M_p);
        return eFailure;
      }
      lVar4 = 0;
      for (uVar6 = 0; uVar6 < pTVar2->pdf_palettesize; uVar6 = uVar6 + 1) {
        pTVar2->pdf_palette[lVar4] = *(uchar *)((long)r + uVar6 * 2 + 1);
        this->mT2p->pdf_palette[lVar4 + 1] = *(uchar *)((long)g + uVar6 * 2 + 1);
        this->mT2p->pdf_palette[lVar4 + 2] = *(uchar *)((long)b + uVar6 * 2 + 1);
        pTVar2 = this->mT2p;
        lVar4 = lVar4 + 3;
      }
      pTVar2->pdf_palettesize = pTVar2->pdf_palettesize * 3;
      return eSuccess;
    }
    pTVar5 = Trace::DefaultTrace();
    pcVar7 = (this->mT2p->inputFilePath)._M_dataplus._M_p;
    inFormat = "TIFFImageHandler::ReadTIFFPageInformation, Palettized image %s has no color map";
  }
  else {
    pTVar5 = Trace::DefaultTrace();
    pcVar7 = (this->mT2p->inputFilePath)._M_dataplus._M_p;
    inFormat = 
    "TIFFImageHandler::ReadTIFFPageInformation, No support for palettized image %s with not one sample per pixel"
    ;
  }
  Trace::TraceToLog(pTVar5,inFormat,pcVar7);
  return eFailure;
}

Assistant:

EStatusCode TIFFImageHandler::ReadPhotometricPalette()
{
	EStatusCode status = PDFHummus::eSuccess;
	uint16_t* r;
	uint16_t* g;
	uint16_t* b;

	do
	{
		if(mT2p->tiff_samplesperpixel!=1)
		{
			TRACE_LOG1(
				"TIFFImageHandler::ReadTIFFPageInformation, No support for palettized image %s with not one sample per pixel",
				mT2p->inputFilePath.c_str());
			status = PDFHummus::eFailure;
			break;
		}
		mT2p->pdf_colorspace= (t2p_cs_t)(T2P_CS_RGB | T2P_CS_PALETTE);
		mT2p->pdf_palettesize=0x0001<<mT2p->tiff_bitspersample;
		if(!TIFFGetField(mT2p->input, TIFFTAG_COLORMAP, &r, &g, &b))
		{
			TRACE_LOG1(
				"TIFFImageHandler::ReadTIFFPageInformation, Palettized image %s has no color map",
				mT2p->inputFilePath.c_str());
			status = PDFHummus::eFailure;
			break;
		} 
		if(mT2p->pdf_palette != NULL)
		{
			_TIFFfree(mT2p->pdf_palette);
			mT2p->pdf_palette=NULL;
		}
		mT2p->pdf_palette = (unsigned char*)
			_TIFFmalloc(mT2p->pdf_palettesize*3);
		if(mT2p->pdf_palette==NULL)
		{
			TRACE_LOG2(
				"TIFFImageHandler::ReadTIFFPageInformation, Can't allocate %u bytes of memory for t2p_read_tiff_image, %s",
				mT2p->pdf_palettesize,
				mT2p->inputFilePath.c_str()
				);
			status = PDFHummus::eFailure;
			break;
		}
		for(int i=0;i<mT2p->pdf_palettesize;i++)
		{
			mT2p->pdf_palette[(i*3)]  = (unsigned char) (r[i]>>8);
			mT2p->pdf_palette[(i*3)+1]= (unsigned char) (g[i]>>8);
			mT2p->pdf_palette[(i*3)+2]= (unsigned char) (b[i]>>8);
		}
		mT2p->pdf_palettesize *= 3;
	}while(false);

	return status;
}